

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldSerializeNotANumber_Test::TestBody
          (TextSerializerTest_shouldSerializeNotANumber_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  StringLike<std::__cxx11::basic_string<char>_> *substring;
  char *message;
  pointer *__ptr;
  double dVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_b8;
  char local_98 [8];
  undefined8 *local_90;
  AssertHelper local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 local_58 [16];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  message = "";
  dVar3 = nan("");
  (this->super_TextSerializerTest).metric.gauge.value = dVar3;
  pcVar2 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,
             pcVar2 + (this->super_TextSerializerTest).name._M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  testing::HasSubstr<std::__cxx11::string>(&local_48,(testing *)&local_68,substring);
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_48.impl_.substring_._M_dataplus._M_p,
             local_48.impl_.substring_._M_dataplus._M_p + local_48.impl_.substring_._M_string_length
            );
  local_88[0].data_ = (AssertHelperData *)local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,local_b8._M_dataplus._M_p,
             local_b8._M_dataplus._M_p + local_b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  (anonymous_namespace)::TextSerializerTest::Serialize_abi_cxx11_(&local_b8,this,Gauge);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_98,(char *)local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "Serialize(MetricType::Gauge)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_88[0].data_ != (AssertHelperData *)local_78) {
    operator_delete(local_88[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.impl_.substring_._M_dataplus._M_p != &local_48.impl_.substring_.field_2) {
    operator_delete(local_48.impl_.substring_._M_dataplus._M_p);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_98[0] == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if (local_90 != (undefined8 *)0x0) {
      message = (char *)*local_90;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x29,message);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_90 != local_90 + 2) {
      operator_delete((undefined8 *)*local_90);
    }
    operator_delete(local_90);
  }
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldSerializeNotANumber) {
  metric.gauge.value = std::nan("");
  EXPECT_THAT(Serialize(MetricType::Gauge), testing::HasSubstr(name + " Nan"));
}